

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O3

void __thiscall
siamese::RecoveryMatrixState::PopulateColumns
          (RecoveryMatrixState *this,uint oldColumns,uint newColumns)

{
  OriginalPacket *pOVar1;
  uint uVar2;
  DecoderSubwindow **ppDVar3;
  DecoderSubwindow *pDVar4;
  ColumnInfo *pCVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  DecoderPacketWindow *pDVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar15;
  int iVar14;
  
  if (oldColumns < newColumns) {
    pktalloc::LightVector<siamese::RecoveryMatrixState::ColumnInfo,_25U>::SetSize_Copy
              (&this->Columns,newColumns);
    uVar2 = this->PreviousNextCheckStart;
    uVar9 = this->CheckedRegion->NextCheckStart;
    this->PreviousNextCheckStart = uVar9;
    uVar13 = this->CheckedRegion->ElementStart;
    uVar7 = uVar13;
    if (uVar13 < uVar2) {
      uVar7 = uVar2;
    }
    uVar9 = uVar9 + 0x3f >> 6;
    if (uVar7 >> 6 < uVar9) {
      pDVar10 = this->Window;
      uVar12 = (ulong)(uVar7 & 0x3f);
      if (uVar2 < uVar13) {
        uVar2 = uVar13;
      }
      uVar8 = (ulong)(uVar2 >> 6);
      ppDVar3 = (pDVar10->Subwindows).DataPtr;
      do {
        pDVar4 = ppDVar3[uVar8];
        if (pDVar4->GotCount < 0x40) {
          pCVar5 = (this->Columns).DataPtr;
          do {
            uVar15 = ~(&pDVar4->Got)[uVar12 >> 6].Words[0] >> (uVar12 & 0x3f);
            if (uVar15 == 0) break;
            iVar14 = 0;
            for (uVar6 = uVar15; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
              iVar14 = iVar14 + 1;
            }
            if ((uVar15 & 1) != 0) {
              iVar14 = 0;
            }
            uVar13 = iVar14 + (int)uVar12;
            if (0x3f < uVar13) break;
            pOVar1 = (pDVar4->Originals)._M_elems + uVar13;
            uVar11 = (uVar13 | (int)uVar8 << 6) + pDVar10->ColumnStart & 0x3fffff;
            pCVar5[(int)oldColumns].Column = uVar11;
            uVar11 = uVar11 * 199;
            pCVar5[(int)oldColumns].Original = pOVar1;
            pCVar5[(int)oldColumns].CX = (char)uVar11 + (char)(uVar11 / 0xfd) * '\x03' + '\x03';
            pOVar1->Column = oldColumns;
            oldColumns = oldColumns + 1;
            if (newColumns <= oldColumns) {
              return;
            }
            uVar12 = (ulong)(uVar13 + 1);
          } while (uVar13 != 0x3f);
        }
        uVar8 = uVar8 + 1;
        uVar12 = 0;
      } while (uVar8 != (uVar9 + (uVar2 >> 6)) - (uVar7 >> 6));
    }
    else {
      pDVar10 = this->Window;
    }
    pDVar10->EmergencyDisabled = true;
  }
  return;
}

Assistant:

void RecoveryMatrixState::PopulateColumns(const unsigned oldColumns, const unsigned newColumns)
{
    if (oldColumns >= newColumns)
        return;

    Columns.SetSize_Copy(newColumns);

    // Resume adding from the last stop point
    unsigned elementStart     = PreviousNextCheckStart;
    PreviousNextCheckStart    = CheckedRegion->NextCheckStart;
    const unsigned elementEnd = CheckedRegion->NextCheckStart;
    if (elementStart < CheckedRegion->ElementStart)
        elementStart = CheckedRegion->ElementStart;

    // The column count increased which means we should have some columns to check
    SIAMESE_DEBUG_ASSERT(elementStart < elementEnd);

    // Check the current subwindow for next lost packet:
    const unsigned subwindowEnd = (elementEnd + kSubwindowSize - 1) / kSubwindowSize;
    unsigned subwindowIndex     = elementStart / kSubwindowSize;

    unsigned bitIndex = elementStart % kSubwindowSize;
    unsigned column   = oldColumns;

    while (subwindowIndex < subwindowEnd)
    {
        SIAMESE_DEBUG_ASSERT(subwindowIndex < Window->Subwindows.GetSize());

        DecoderSubwindow* subwindowPtr = Window->Subwindows.GetRef(subwindowIndex);

        // If there may be any lost packets in this subwindow:
        if (subwindowPtr->GotCount < kSubwindowSize)
        {
            do
            {
                // Seek next clear bit
                bitIndex = subwindowPtr->Got.FindFirstClear(bitIndex);

                // If there were none, skip this subwindow
                if (bitIndex >= kSubwindowSize)
                    break;

                // Calculate element index and stop if we hit the end of the valid data
                const unsigned element = subwindowIndex * kSubwindowSize + bitIndex;
                SIAMESE_DEBUG_ASSERT(element < elementEnd);

                ColumnInfo* columnPtr = Columns.GetPtr(column);
                columnPtr->Column     = Window->ElementToColumn(element);
                columnPtr->Original   = &subwindowPtr->Originals[bitIndex];
                columnPtr->CX         = GetColumnValue(columnPtr->Column);

                // Point lost original packet to recovery matrix column
                SIAMESE_DEBUG_ASSERT(columnPtr->Original->Buffer.Bytes == 0);
                columnPtr->Original->Column = column;

                // If we just added the last column:
                if (++column >= newColumns)
                    return;

            } while (++bitIndex < kSubwindowSize);
        }

        // Reset bit index to the front of the next subwindow
        bitIndex = 0;

        // Check next subwindow
        ++subwindowIndex;
    }

    SIAMESE_DEBUG_BREAK(); // Should never get here
    Window->EmergencyDisabled = true;
}